

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

int forward(int menu)

{
  int iVar1;
  menuwindow *pmVar2;
  menustate *pmVar3;
  Fl_Menu_Item *pFVar4;
  int *piVar5;
  int n;
  
  pmVar3 = p;
  if (menu == -1) {
    menu = 0;
  }
  pmVar2 = p->p[menu];
  piVar5 = &pmVar2->selected;
  if (menu == p->menu_number) {
    piVar5 = &p->item_number;
  }
  n = *piVar5;
  iVar1 = pmVar2->numitems;
  do {
    n = n + 1;
    if (iVar1 <= n) {
      return 0;
    }
    pFVar4 = Fl_Menu_Item::next(pmVar2->menu,n);
  } while ((pFVar4->flags & 0x11) != 0);
  pmVar3->current_item = pFVar4;
  pmVar3->menu_number = menu;
  pmVar3->item_number = n;
  return 1;
}

Assistant:

static int forward(int menu) { // go to next item in menu menu if possible
  menustate &pp = *p;
  // Fl_Menu_Button can generate menu=-1. This line fixes it and selectes the first item.
  if (menu==-1) 
    menu = 0;
  menuwindow &m = *(pp.p[menu]);
  int item = (menu == pp.menu_number) ? pp.item_number : m.selected;
  while (++item < m.numitems) {
    const Fl_Menu_Item* m1 = m.menu->next(item);
    if (m1->activevisible()) {setitem(m1, menu, item); return 1;}
  }
  return 0;
}